

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

Board * pyramid_boardCreate(Card **cards,unsigned_long cardsCount)

{
  Board *pBVar1;
  void *pvVar2;
  uchar i;
  Board *board;
  Board *in_stack_ffffffffffffffc0;
  Board *spot;
  Board *in_stack_ffffffffffffffd0;
  Board *board_00;
  byte local_19;
  
  pBVar1 = board_create();
  spot = pBVar1;
  spot_create((SPOTTYPE)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
              (uchar)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  board_spotAdd(in_stack_ffffffffffffffd0,(Spot *)spot);
  board_00 = pBVar1;
  spot_create((SPOTTYPE)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
              (uchar)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  board_spotAdd(board_00,(Spot *)spot);
  spot_create((SPOTTYPE)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
              (uchar)((ulong)in_stack_ffffffffffffffc0 >> 0x30));
  board_spotAdd(board_00,(Spot *)spot);
  for (local_19 = 0; local_19 < 0x1c; local_19 = local_19 + 1) {
    in_stack_ffffffffffffffc0 = pBVar1;
    spot_create((SPOTTYPE)((ulong)pBVar1 >> 0x38),(uchar)((ulong)pBVar1 >> 0x30));
    board_spotAdd(board_00,(Spot *)spot);
  }
  for (local_19 = 0; local_19 < 0x1c; local_19 = local_19 + 1) {
    board_cardAdd(board_00,(SPOTTYPE)((ulong)spot >> 0x38),(uchar)((ulong)spot >> 0x30),
                  (Card *)in_stack_ffffffffffffffc0);
  }
  for (; local_19 < 0x34; local_19 = local_19 + 1) {
    board_cardAdd(board_00,(SPOTTYPE)((ulong)spot >> 0x38),(uchar)((ulong)spot >> 0x30),
                  (Card *)in_stack_ffffffffffffffc0);
  }
  if (((gConfig.game)->id == PYRAMIDEASY) || ((gConfig.game)->id == PYRAMIDRELAXEDEASY)) {
    pvVar2 = malloc(1);
    pBVar1->gameState = pvVar2;
    *(undefined1 *)pBVar1->gameState = 0;
  }
  return pBVar1;
}

Assistant:

Board * pyramid_boardCreate(Card ** cards, unsigned long cardsCount)
{
	Board * board = board_create();
	unsigned char i;

	board_spotAdd(board, spot_create(STOCK, 0));
	board_spotAdd(board, spot_create(FOUNDATION, 0));
	board_spotAdd(board, spot_create(WASTE, 0));

	for(i=0;i<28;i++)
	{
		board_spotAdd(board, spot_create(TABLEAU, i));
	}

	for(i=0;i<28;i++)
	{
		board_cardAdd(board, TABLEAU, i, cards[i]);
	}
	for(;i<52;i++)
	{
		board_cardAdd(board, STOCK, 0, cards[i]);
	}

	if(gConfig.game->id==PYRAMIDEASY || gConfig.game->id==PYRAMIDRELAXEDEASY)
	{
		board->gameState = (unsigned char *)malloc(sizeof(unsigned char));
		*(unsigned char *)board->gameState = 0;
	}

	return board;
}